

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRT.cpp
# Opt level: O0

void __thiscall
Outputs::CRT::CRT::set_new_display_type(CRT *this,int cycles_per_line,Type displayType)

{
  int height_of_display;
  Type displayType_local;
  int cycles_per_line_local;
  CRT *this_local;
  
  if (displayType < NTSC60) {
    (this->scan_target_modals_).intended_gamma = 2.8;
    height_of_display = 0x106;
    if (displayType == PAL50) {
      height_of_display = 0x138;
    }
    set_new_timing(this,cycles_per_line,height_of_display,YUV,0xad303,0x9c4,5,true);
  }
  else if (displayType == NTSC60) {
    (this->scan_target_modals_).intended_gamma = 2.2;
    set_new_timing(this,cycles_per_line,0x106,YIQ,0x1c7,2,6,false);
  }
  return;
}

Assistant:

void CRT::set_new_display_type(int cycles_per_line, Outputs::Display::Type displayType) {
	switch(displayType) {
		case Outputs::Display::Type::PAL50:
		case Outputs::Display::Type::PAL60:
			scan_target_modals_.intended_gamma = 2.8f;
			set_new_timing(cycles_per_line, (displayType == Outputs::Display::Type::PAL50) ? 312 : 262, Outputs::Display::ColourSpace::YUV, 709379, 2500, 5, true);
					// i.e. 283.7516 colour cycles per line; 2.5 lines = vertical sync.
		break;

		case Outputs::Display::Type::NTSC60:
			scan_target_modals_.intended_gamma = 2.2f;
			set_new_timing(cycles_per_line, 262, Outputs::Display::ColourSpace::YIQ, 455, 2, 6, false);			// i.e. 227.5 colour cycles per line, 3 lines = vertical sync.
		break;
	}
}